

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseExternalSubset(xmlParserCtxtPtr ctxt,xmlChar *ExternalID,xmlChar *SystemID)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlParserInputPtr pxVar3;
  unsigned_long uVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlCharEncoding enc;
  undefined8 in_RAX;
  xmlDocPtr pxVar7;
  xmlChar start [4];
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  xmlDetectSAX2(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if ((ctxt->encoding == (xmlChar *)0x0) &&
     (pxVar2 = ctxt->input->cur, 3 < (long)ctxt->input->end - (long)pxVar2)) {
    uStack_28 = CONCAT17(pxVar2[3],
                         CONCAT16(pxVar2[2],
                                  CONCAT15(pxVar2[1],CONCAT14(*pxVar2,(undefined4)uStack_28))));
    enc = xmlDetectCharEncoding((uchar *)((long)&uStack_28 + 4),4);
    if (enc != XML_CHAR_ENCODING_NONE) {
      xmlSwitchEncoding(ctxt,enc);
    }
  }
  pxVar2 = ctxt->input->cur;
  if ((((*pxVar2 == '<') && (pxVar2[1] == '?')) && (pxVar2[2] == 'x')) &&
     (((pxVar2[3] == 'm' && (pxVar2[4] == 'l')) && (xmlParseTextDecl(ctxt), ctxt->errNo == 0x20))))
  {
    xmlHaltParser(ctxt);
  }
  else {
    if (ctxt->myDoc == (xmlDocPtr)0x0) {
      pxVar7 = xmlNewDoc("1.0");
      ctxt->myDoc = pxVar7;
      if (pxVar7 == (xmlDocPtr)0x0) {
        xmlErrMemory(ctxt,"New Doc failed");
        return;
      }
      pxVar7->properties = 0x40;
    }
    pxVar7 = ctxt->myDoc;
    if ((pxVar7 != (xmlDocPtr)0x0) && (pxVar7->intSubset == (_xmlDtd *)0x0)) {
      xmlCreateIntSubset(pxVar7,(xmlChar *)0x0,ExternalID,SystemID);
    }
    ctxt->instate = XML_PARSER_DTD;
    ctxt->external = 1;
    xmlSkipBlankChars(ctxt);
    do {
      pxVar3 = ctxt->input;
      pxVar2 = pxVar3->cur;
      if (*pxVar2 == '<') {
        if ((pxVar2[1] != '?') && (pxVar2[1] != '!')) goto LAB_0015f865;
      }
      else if (*pxVar2 != '%') goto LAB_0015f865;
      iVar1 = pxVar3->id;
      uVar4 = pxVar3->consumed;
      pxVar5 = pxVar3->base;
      if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar2 < 0xfa)) {
        xmlGROW(ctxt);
      }
      pxVar6 = ctxt->input->cur;
      if (((*pxVar6 == '<') && (pxVar6[1] == '!')) && (pxVar6[2] == '[')) {
        xmlParseConditionalSections(ctxt);
      }
      else {
        xmlParseMarkupDecl(ctxt);
      }
      xmlSkipBlankChars(ctxt);
      pxVar3 = ctxt->input;
    } while ((iVar1 != pxVar3->id) ||
            (pxVar2 + (uVar4 - (long)pxVar5) !=
             pxVar3->cur + (pxVar3->consumed - (long)pxVar3->base)));
    xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
LAB_0015f865:
    if (*ctxt->input->cur != '\0') {
      xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
    }
  }
  return;
}

Assistant:

void
xmlParseExternalSubset(xmlParserCtxtPtr ctxt, const xmlChar *ExternalID,
                       const xmlChar *SystemID) {
    xmlDetectSAX2(ctxt);
    GROW;

    if ((ctxt->encoding == NULL) &&
        (ctxt->input->end - ctxt->input->cur >= 4)) {
        xmlChar start[4];
	xmlCharEncoding enc;

	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(start, 4);
	if (enc != XML_CHAR_ENCODING_NONE)
	    xmlSwitchEncoding(ctxt, enc);
    }

    if (CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) {
	xmlParseTextDecl(ctxt);
	if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	    /*
	     * The XML REC instructs us to stop parsing right here
	     */
	    xmlHaltParser(ctxt);
	    return;
	}
    }
    if (ctxt->myDoc == NULL) {
        ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
	if (ctxt->myDoc == NULL) {
	    xmlErrMemory(ctxt, "New Doc failed");
	    return;
	}
	ctxt->myDoc->properties = XML_DOC_INTERNAL;
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->intSubset == NULL))
        xmlCreateIntSubset(ctxt->myDoc, NULL, ExternalID, SystemID);

    ctxt->instate = XML_PARSER_DTD;
    ctxt->external = 1;
    SKIP_BLANKS;
    while (((RAW == '<') && (NXT(1) == '?')) ||
           ((RAW == '<') && (NXT(1) == '!')) ||
	   (RAW == '%')) {
	int id = ctxt->input->id;
	unsigned long cons = CUR_CONSUMED;

	GROW;
        if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
	    xmlParseConditionalSections(ctxt);
	} else
	    xmlParseMarkupDecl(ctxt);
        SKIP_BLANKS;

	if ((id == ctxt->input->id) && (cons == CUR_CONSUMED)) {
	    xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
	    break;
	}
    }

    if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
    }

}